

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-mltpctive-dynamical-system.cpp
# Opt level: O0

void __thiscall
stateObservation::IMUMltpctiveDynamicalSystem::stateDifference
          (IMUMltpctiveDynamicalSystem *this,Vector *stateVector1,Vector *stateVector2,
          Vector *difference)

{
  Type local_628;
  Type local_5f8;
  Type local_5c8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
  local_598;
  Type local_530;
  Type local_500;
  Type local_4d0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
  local_4a0;
  Type local_438;
  Type local_408;
  Quaternion<double,0> local_3d8 [32];
  Quaternion<double,_0> local_3b8;
  Type local_398;
  Quaternion<double,0> local_368 [32];
  Quaternion<double,_0> local_348;
  Vector3 local_328;
  Type local_310;
  Type local_2e0;
  Type local_2b0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
  local_280;
  Type local_218;
  Type local_1e8;
  Type local_1b8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
  local_188;
  Type local_120;
  Type local_f0;
  Type local_c0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
  local_90;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_28;
  Vector *difference_local;
  Vector *stateVector2_local;
  Vector *stateVector1_local;
  IMUMltpctiveDynamicalSystem *this_local;
  
  local_28 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)difference;
  difference_local = stateVector2;
  stateVector2_local = stateVector1;
  stateVector1_local = (Vector *)this;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&difference->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,0x12);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_c0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)stateVector2_local,0,3)
  ;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_f0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)difference_local,0,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>>::operator-
            (&local_90,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>> *)&local_c0
             ,(MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
               *)&local_f0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_120,local_28,0,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_120,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>_>
              *)&local_90);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_1b8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)stateVector2_local,7,3
            );
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_1e8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)difference_local,7,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>>::operator-
            (&local_188,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>> *)
             &local_1b8,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *
             )&local_1e8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_218,local_28,6,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_218,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>_>
              *)&local_188);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_2b0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)stateVector2_local,0xd
             ,3);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_2e0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)difference_local,0xd,3
            );
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>>::operator-
            (&local_280,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>> *)
             &local_2b0,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *
             )&local_2e0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_310,local_28,0xc,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_310,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>_>
              *)&local_280);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<4>
            (&local_398,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)stateVector2_local,3,4
            );
  Eigen::Quaternion<double,0>::
  Quaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,4,1,false>>
            (local_368,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>_> *
             )&local_398);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<4>
            (&local_408,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)difference_local,3,4);
  Eigen::Quaternion<double,0>::
  Quaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,4,1,false>>
            (local_3d8,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_4,_1,_false>_> *
             )&local_408);
  Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::conjugate
            (&local_3b8,(QuaternionBase<Eigen::Quaternion<double,_0>_> *)local_3d8);
  Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*
            (&local_348,(QuaternionBase<Eigen::Quaternion<double,0>> *)local_368,
             (QuaternionBase<Eigen::Quaternion<double,_0>_> *)&local_3b8);
  kine::quaternionToRotationVector(&local_328,&local_348);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_438,local_28,3,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_438,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_328);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_4d0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)stateVector2_local,10,
             3);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_500,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)difference_local,10,3)
  ;
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>>::operator-
            (&local_4a0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>> *)
             &local_4d0,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *
             )&local_500);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_530,local_28,9,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_530,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>_>
              *)&local_4a0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_5c8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)stateVector2_local,
             0x10,3);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_5f8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)difference_local,0x10,
             3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,3,1,false>>::operator-
            (&local_598,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>> *)
             &local_5c8,
             (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *
             )&local_5f8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_628,local_28,0xf,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_628,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>_>
              *)&local_598);
  return;
}

Assistant:

void IMUMltpctiveDynamicalSystem::stateDifference(const Vector & stateVector1,
                                                  const Vector & stateVector2,
                                                  Vector & difference)
{
  difference.resize(indexesTangent::size);
  difference.segment<3>(indexesTangent::pos) =
      stateVector1.segment<3>(indexes::pos) - stateVector2.segment<3>(indexes::pos);
  difference.segment<3>(indexesTangent::linVel) =
      stateVector1.segment<3>(indexes::linVel) - stateVector2.segment<3>(indexes::linVel);
  difference.segment<3>(indexesTangent::linAcc) =
      stateVector1.segment<3>(indexes::linAcc) - stateVector2.segment<3>(indexes::linAcc);

  difference.segment<3>(indexesTangent::ori) =
      kine::quaternionToRotationVector(Quaternion(stateVector1.segment<4>(indexes::ori))
                                       * Quaternion(stateVector2.segment<4>(indexes::ori)).conjugate());
  difference.segment<3>(indexesTangent::angVel) =
      stateVector1.segment<3>(indexes::angVel) - stateVector2.segment<3>(indexes::angVel);
  difference.segment<3>(indexesTangent::angAcc) =
      stateVector1.segment<3>(indexes::angAcc) - stateVector2.segment<3>(indexes::angAcc);
}